

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpCommand.cpp
# Opt level: O2

int __thiscall CSIZECommand::doWhat(CSIZECommand *this,CClient *pClient)

{
  EFTPSTATE EVar1;
  long lVar2;
  string *this_00;
  allocator local_1039;
  string ret;
  char buffer [4096];
  
  EVar1 = CClient::GetClientState(pClient);
  if ((int)EVar1 < 3) {
    std::__cxx11::string::string
              ((string *)buffer,"530 Please login with USER and PASS.\r\n",(allocator *)&ret);
    CClient::sendMsg(pClient,(string *)buffer);
    this_00 = (string *)buffer;
  }
  else {
    bzero(buffer,0x1000);
    lVar2 = GetFileSize(this,pClient);
    if (-1 < lVar2) {
      sprintf(buffer,"213 %ld\r\n",lVar2);
      std::__cxx11::string::string((string *)&ret,buffer,&local_1039);
      CClient::sendMsg(pClient,&ret);
      std::__cxx11::string::~string((string *)&ret);
      return 1;
    }
    std::__cxx11::string::string((string *)&ret,"550 Could not get file size.\r\n",&local_1039);
    CClient::sendMsg(pClient,&ret);
    this_00 = &ret;
  }
  std::__cxx11::string::~string((string *)this_00);
  return -1;
}

Assistant:

int CSIZECommand::doWhat(CClient *pClient) {
    if(pClient->GetClientState() >= PASS){
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        long size = GetFileSize(pClient);
        if(size >= 0){
            sprintf(buffer,"213 %ld\r\n",size);
            string ret(buffer);
            pClient->sendMsg(ret);
            return 1;
        }
        else{
            string ret = "550 Could not get file size.\r\n";
            pClient->sendMsg(ret);
            return -1;
        }
    }
    else{
        string ret = "530 Please login with USER and PASS.\r\n";
        pClient->sendMsg(ret);
        return -1;
    }
}